

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O0

void __thiscall
ParticleTest_Assignment_Test<pica::Particle<(pica::Dimension)3>_>::TestBody
          (ParticleTest_Assignment_Test<pica::Particle<(pica::Dimension)3>_> *this)

{
  Particle<(pica::Dimension)3> a;
  Particle<(pica::Dimension)3> b;
  ulong uVar1;
  bool bVar2;
  AssertionResult gtest_ar_;
  ParticleType copyParticle;
  ParticleType particle;
  FactorType factor;
  MomentumType momentum;
  PositionType position;
  undefined1 local_248 [7];
  Particle<(pica::Dimension)3> *in_stack_fffffffffffffdc0;
  FactorType in_stack_fffffffffffffdc8;
  MomentumType *in_stack_fffffffffffffdd0;
  PositionType *in_stack_fffffffffffffdd8;
  Particle<(pica::Dimension)3> *in_stack_fffffffffffffde0;
  Real in_stack_fffffffffffffde8;
  Real in_stack_fffffffffffffdf0;
  Real in_stack_fffffffffffffdf8;
  BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  undefined1 auVar3 [24];
  undefined1 in_stack_fffffffffffffe60 [48];
  undefined8 in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  undefined8 in_stack_fffffffffffffea0;
  Message *in_stack_fffffffffffffea8;
  AssertHelper *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  AssertionResult *in_stack_fffffffffffffec8;
  BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  String *pSStack_120;
  char *pcStack_110;
  undefined8 local_108;
  int iStack_104;
  char *pcStack_100;
  undefined8 local_f8;
  Type TStack_f4;
  AssertHelper *pAStack_f0;
  AssertionResult local_e0;
  undefined1 local_d0 [72];
  undefined1 local_88 [72];
  undefined8 local_40;
  Vector3<double> local_38 [2];
  
  BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>::getPosition
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
             in_stack_fffffffffffffde8);
  pica::Vector3<double>::Vector3(local_38,431.124,-54.12,5643.176);
  local_40 = 0x3fffe978d4fdf3b6;
  pica::Particle<(pica::Dimension)3>::Particle
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
             in_stack_fffffffffffffdc8,(TypeIndexType)((ulong)in_stack_fffffffffffffdc0 >> 0x30));
  pica::Particle<(pica::Dimension)3>::Particle(in_stack_fffffffffffffdc0);
  memcpy(local_d0,local_88,0x42);
  memcpy(&stack0xfffffffffffffed8,local_88,0x48);
  _local_248 = in_stack_fffffffffffffed8;
  memcpy(&stack0xfffffffffffffe90,local_d0,0x48);
  a.position.y._0_4_ = in_stack_fffffffffffffe58;
  a.position.x = (double)local_248;
  a.position.y._4_4_ = in_stack_fffffffffffffe5c;
  auVar3 = in_stack_fffffffffffffe60._8_24_;
  a.position.z = (double)in_stack_fffffffffffffe60._0_8_;
  a.p.x = (double)auVar3._0_8_;
  a.p.y = (double)auVar3._8_8_;
  a.p.z = (double)auVar3._16_8_;
  a.factor = (FactorType)in_stack_fffffffffffffe60._32_8_;
  a.invGamma = (GammaType)in_stack_fffffffffffffe60._40_8_;
  a._64_8_ = in_stack_fffffffffffffe90;
  b.position.y = (double)in_stack_fffffffffffffea0;
  b.position.x = (double)in_stack_fffffffffffffe98;
  b.position.z = (double)in_stack_fffffffffffffea8;
  b.p.x = (double)in_stack_fffffffffffffeb0;
  b.p.y = (double)in_stack_fffffffffffffeb8;
  b.p.z = (double)in_stack_fffffffffffffec0;
  b.factor = (FactorType)in_stack_fffffffffffffec8;
  b.invGamma = (GammaType)in_stack_fffffffffffffed0;
  b._64_8_ = _local_248;
  BaseParticleFixture<pica::Particle<(pica::Dimension)3>>::
  eqParticles_<pica::Particle<(pica::Dimension)3>,pica::Particle<(pica::Dimension)3>>
            (in_stack_fffffffffffffed0,a,b);
  uVar1 = (ulong)_local_248 >> 0x38;
  testing::AssertionResult::AssertionResult((AssertionResult *)pSStack_120,SUB81(uVar1,0));
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_e0);
  if (!bVar2) {
    testing::Message::Message((Message *)pAStack_f0);
    testing::internal::GetBoolAssertionFailureMessage
              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
               (char *)in_stack_fffffffffffffeb0);
    testing::internal::String::c_str((String *)&stack0xfffffffffffffe60);
    testing::internal::AssertHelper::AssertHelper
              (pAStack_f0,TStack_f4,pcStack_100,iStack_104,pcStack_110);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pSStack_120);
    testing::internal::String::~String(pSStack_120);
    testing::Message::~Message((Message *)0x1fe0c3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1fe16d);
  return;
}

Assistant:

TYPED_TEST(ParticleTest, Assignment)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::PositionType PositionType;
    typedef typename ParticleTest<TypeParam>::MomentumType MomentumType;
    typedef typename ParticleTest<TypeParam>::GammaType GammaType;
    typedef typename ParticleTest<TypeParam>::FactorType FactorType;

    PositionType position = this->getPosition(432.453, -3452.15, -15.125);
    MomentumType momentum(431.124, -54.12, 5643.176);
    FactorType factor = 1.9945;
    ParticleType particle(position, momentum, factor, 0);
    ParticleType copyParticle;
    copyParticle = particle;
    ASSERT_TRUE(this->eqParticles_(particle, copyParticle));
}